

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matcreat.c
# Opt level: O3

MATRIX mat_copy(MATRIX A)

{
  int iVar1;
  uint uVar2;
  double *pdVar3;
  double *pdVar4;
  MATRIX ppdVar5;
  long lVar6;
  ulong uVar7;
  
  ppdVar5 = _mat_creat(*(int *)(A + -1),*(int *)((long)A + -4));
  if ((ppdVar5 != (MATRIX)0x0) && (iVar1 = *(int *)(A + -1), 0 < (long)iVar1)) {
    uVar2 = *(uint *)((long)A + -4);
    lVar6 = 0;
    do {
      if (0 < (int)uVar2) {
        pdVar3 = A[lVar6];
        pdVar4 = ppdVar5[lVar6];
        uVar7 = 0;
        do {
          pdVar4[uVar7] = pdVar3[uVar7];
          uVar7 = uVar7 + 1;
        } while (uVar2 != uVar7);
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 != iVar1);
  }
  return ppdVar5;
}

Assistant:

MATRIX mat_copy( MATRIX A )
{
	int	i, j;
	MATRIX	C;

	if ((C = mat_creat( MatRow(A), MatCol(A), UNDEFINED )) == NULL)
		return (NULL);

	for (i=0; i<MatRow(A); i++)
	for (j=0; j<MatCol(A); j++)
		{
		C[i][j] = A[i][j];
		}
	return (C);
}